

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseArray(Parser *this,Value *array)

{
  ushort uVar1;
  BaseType BVar2;
  StructDef *pSVar3;
  Value *pVVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char cVar6;
  uoffset_t uVar7;
  int iVar8;
  uoffset64_t element;
  Type *in_RDX;
  Parser *this_00;
  Value *val;
  ulong uVar9;
  CheckedError ce;
  uint8_t elem;
  vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> stack;
  size_type __dnew;
  FlatBufferBuilder builder;
  undefined1 local_142 [10];
  Value local_138;
  vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> local_e8;
  ulong local_d0;
  Type *local_c8;
  EnumDef *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  char *local_a0;
  uint local_98;
  size_t local_90;
  _Alloc_hider local_88;
  uint local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined6 uStack_68;
  pointer ppSStack_62;
  pointer local_58;
  undefined2 local_50;
  size_t local_48;
  undefined2 local_40;
  _Base_ptr local_38;
  
  local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (Value *)0x0;
  local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (Value *)0x0;
  local_b0._0_8_ = (Allocator *)0x0;
  local_b0[8] = false;
  local_a0 = (char *)0x400;
  local_98 = 0x7fffffff;
  local_90 = 8;
  local_88._M_p = (pointer)0x0;
  local_80 = 0;
  local_58 = (pointer)0x0;
  local_50 = 0;
  local_78._M_allocated_capacity = 0;
  local_78._8_6_ = 0;
  local_78._14_2_ = 0;
  uStack_68 = 0;
  ppSStack_62 = (pointer)0x0;
  local_48 = 1;
  local_40._0_1_ = false;
  local_40._1_1_ = true;
  local_38 = (_Base_ptr)0x0;
  BVar2 = in_RDX->element;
  pSVar3 = in_RDX->struct_def;
  local_c0 = in_RDX->enum_def;
  uVar1 = in_RDX->fixed_length;
  local_142._2_8_ = this;
  local_c8 = in_RDX;
  Expect((Parser *)local_142,(int)array);
  local_142[1] = 1;
  cVar6 = local_142[0];
  if (local_142[0] == '\0') {
    local_d0 = (ulong)uVar1;
    uVar9 = 0;
    do {
      if (((byte)(uVar9 == 0 | array[0xd].field_0x42 ^ 1) == 1) &&
         (*(int *)&(array->type).field_0x1c == 0x5d)) {
LAB_00110992:
        this_00 = (Parser *)local_142;
        Next(this_00);
        cVar6 = local_142[0];
        if (local_142[0] != '\x01') {
          *(undefined1 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0;
          local_142[0] = 0;
          local_142[1] = '\x01';
          *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
          if (uVar9 != local_d0) {
            local_b8 = 0x25;
            local_138.type._0_8_ = (char *)((long)&local_138 + 0x10U);
            local_138.type._0_8_ =
                 std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_b8);
            local_138.type.enum_def._0_2_ = (undefined2)local_b8;
            local_138.type.enum_def._2_6_ = (undefined6)((ulong)local_b8 >> 0x10);
            builtin_strncpy((char *)local_138.type._0_8_,"Fixed-length array size is incorrect.",
                            0x25);
            *(char *)(local_138.type._0_8_ + local_b8) = '\0';
            local_138.type.struct_def._0_2_ = local_138.type.enum_def._0_2_;
            local_138.type.struct_def._2_6_ = local_138.type.enum_def._2_6_;
            Error((Parser *)local_142._2_8_,(string *)array);
            if ((char *)local_138.type._0_8_ != (char *)((long)&local_138 + 0x10U)) {
              operator_delete((void *)local_138.type._0_8_,
                              CONCAT62(local_138.type.enum_def._2_6_,local_138.type.enum_def._0_2_)
                              + 1);
            }
            goto LAB_001109b7;
          }
          if (local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_00110e7a;
          pVVar4 = local_e8.
                   super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00110a39;
        }
        break;
      }
      local_138.type.enum_def._0_2_ = 0;
      local_138.type.enum_def._2_6_ = 0;
      local_138.type.fixed_length = 0;
      local_138.type._0_8_ = (char *)0x0;
      local_138.type.struct_def._0_2_ = 0;
      local_138.type.struct_def._2_6_ = 0;
      paVar5 = &local_138.constant.field_2;
      local_138.constant.field_2._M_allocated_capacity._0_2_ = 0x30;
      local_138.constant._M_string_length = 1;
      local_138.offset = 0xffff;
      local_138.constant._M_dataplus._M_p = (pointer)paVar5;
      std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::
      emplace_back<flatbuffers::Value>(&local_e8,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.constant._M_dataplus._M_p != paVar5) {
        operator_delete(local_138.constant._M_dataplus._M_p,
                        CONCAT62(local_138.constant.field_2._2_6_,
                                 local_138.constant.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.base_type = BVar2;
      local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.element = BASE_TYPE_NONE;
      local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.struct_def = pSVar3;
      local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.enum_def = local_c0;
      local_e8.super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].type.fixed_length = uVar1;
      if ((BVar2 == BASE_TYPE_STRUCT) && (pSVar3->fixed == true)) {
        ParseTable((Parser *)local_142,(StructDef *)array,(string *)pSVar3,
                   (uoffset_t *)
                   &local_e8.
                    super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].constant);
      }
      else {
        ParseSingleValue((Parser *)local_142,(string *)array,(Value *)0x0,
                         (bool)((char)local_e8.
                                      super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -0x48));
      }
      cVar6 = local_142[0];
      if (local_142[0] != '\0') break;
      local_142._0_2_ = 0x100;
      if (*(int *)&(array->type).field_0x1c == 0x5d) {
        uVar9 = uVar9 + 1;
        goto LAB_00110992;
      }
      if (array[0x12].constant.field_2._M_local_buf[8] == '\0') {
        Expect((Parser *)local_142,(int)array);
        cVar6 = local_142[0];
        if (local_142[0] == '\0') goto LAB_00110976;
      }
      else {
LAB_00110976:
        local_142._0_2_ = 0;
        cVar6 = '\0';
      }
      local_142[1] = 1;
      uVar9 = uVar9 + 1;
    } while (cVar6 == '\0');
  }
  *(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ = cVar6;
  local_142[1] = '\x01';
  *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
  goto LAB_001109b7;
LAB_00110a39:
  do {
    val = pVVar4 + -1;
    switch((val->type).base_type) {
    case BASE_TYPE_NONE:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(uchar *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_138.type.base_type);
      break;
    case BASE_TYPE_UTYPE:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(uchar *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_138.type.base_type);
      break;
    case BASE_TYPE_BOOL:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(uchar *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_138.type.base_type);
      break;
    case BASE_TYPE_CHAR:
      anon_unknown_0::atot<signed_char>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(char *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_138.type.base_type);
      break;
    case BASE_TYPE_UCHAR:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(uchar *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined1)local_138.type.base_type);
      break;
    case BASE_TYPE_SHORT:
      anon_unknown_0::atot<short>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(short *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined2)local_138.type.base_type);
      break;
    case BASE_TYPE_USHORT:
      anon_unknown_0::atot<unsigned_short>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(unsigned_short *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(undefined2)local_138.type.base_type);
      break;
    case BASE_TYPE_INT:
      anon_unknown_0::atot<int>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(int *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,local_138.type.base_type);
      break;
    case BASE_TYPE_UINT:
      anon_unknown_0::atot<unsigned_int>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(uint *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,local_138.type.base_type);
      break;
    case BASE_TYPE_LONG:
      anon_unknown_0::atot<long>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(long *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,local_138.type._0_8_);
      break;
    case BASE_TYPE_ULONG:
      anon_unknown_0::atot<unsigned_long>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(unsigned_long *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,local_138.type._0_8_);
      break;
    case BASE_TYPE_FLOAT:
      anon_unknown_0::atot<float>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(float *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(float)local_138.type.base_type);
      break;
    case BASE_TYPE_DOUBLE:
      anon_unknown_0::atot<double>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(double *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,(double)local_138.type._0_8_);
      break;
    case BASE_TYPE_STRING:
      uVar7 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
      *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0x100;
      uVar7 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      break;
    case BASE_TYPE_VECTOR:
      uVar7 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
      *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0x100;
      uVar7 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      break;
    case BASE_TYPE_STRUCT:
      pSVar3 = pVVar4[-1].type.struct_def;
      if (pSVar3->fixed == true) {
        SerializeStruct(this_00,(FlatBufferBuilder *)local_b0,pSVar3,val);
      }
      else {
        uVar7 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
        *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0x100;
        uVar7 = FlatBufferBuilderImpl<false>::ReferTo
                          ((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
        this_00 = (Parser *)local_b0;
        FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                  ((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      }
      break;
    case BASE_TYPE_UNION:
      uVar7 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
      *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0x100;
      uVar7 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,uVar7);
      break;
    case BASE_TYPE_ARRAY:
      anon_unknown_0::atot<int>
                ((anon_unknown_0 *)local_142._2_8_,pVVar4[-1].constant._M_dataplus._M_p,
                 (Parser *)array,(int *)&local_138);
      *(undefined1 *)((long)&((ParserState *)local_142._2_8_)->prev_cursor_ + 1) = 1;
      if (*(char *)&((ParserState *)local_142._2_8_)->prev_cursor_ != '\0') goto LAB_001109b7;
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,local_138.type.base_type);
      break;
    case BASE_TYPE_VECTOR64:
      iVar8 = atoi(pVVar4[-1].constant._M_dataplus._M_p);
      *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0x100;
      element = FlatBufferBuilderImpl<false>::ReferTo
                          ((FlatBufferBuilderImpl<false> *)local_b0,(long)iVar8);
      this_00 = (Parser *)local_b0;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)local_b0,element);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                    ,0x741,"CheckedError flatbuffers::Parser::ParseArray(Value &)");
    }
    pVVar4 = val;
  } while (val != local_e8.
                  super__Vector_base<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>.
                  _M_impl.super__Vector_impl_data._M_start);
LAB_00110e7a:
  uVar9 = CONCAT26(local_78._14_2_,local_78._8_6_);
  if (uVar9 == 0) {
    __assert_fail("cur_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector_downward.h"
                  ,0xb3,
                  "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]");
  }
  InlineSize(local_c8);
  std::__cxx11::string::_M_replace((ulong)(local_c8 + 1),0,(char *)local_c8[1].struct_def,uVar9);
  *(undefined2 *)&((ParserState *)local_142._2_8_)->prev_cursor_ = 0;
LAB_001109b7:
  if (local_142[1] == '\0') {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_b0);
  std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::~vector(&local_e8);
  return SUB82(local_142._2_8_,0);
}

Assistant:

CheckedError Parser::ParseArray(Value &array) {
  std::vector<Value> stack;
  FlatBufferBuilder builder;
  const auto &type = array.type.VectorType();
  auto length = array.type.fixed_length;
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    stack.emplace_back(Value());
    auto &val = stack.back();
    val.type = type;
    if (IsStruct(type)) {
      ECHECK(ParseTable(*val.type.struct_def, &val.constant, nullptr));
    } else {
      ECHECK(ParseSingleValue(nullptr, val, false));
    }
    return NoError();
  });
  ECHECK(err);
  if (length != count) return Error("Fixed-length array size is incorrect.");

  for (auto it = stack.rbegin(); it != stack.rend(); ++it) {
    auto &val = *it;
    // clang-format off
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) { \
            SerializeStruct(builder, *val.type.struct_def, val); \
          } else { \
            CTYPE elem; \
            ECHECK(atot(val.constant.c_str(), *this, &elem)); \
            builder.PushElement(elem); \
          } \
        break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      default: FLATBUFFERS_ASSERT(0);
    }
    // clang-format on
  }

  array.constant.assign(
      reinterpret_cast<const char *>(builder.GetCurrentBufferPointer()),
      InlineSize(array.type));
  return NoError();
}